

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O1

lzma_ret lzma2_encoder_init(lzma_lz_encoder *lz,lzma_allocator *allocator,void *options,
                           lzma_lz_options_conflict *lz_options)

{
  lzma_ret lVar1;
  lzma_coder_conflict7 *plVar2;
  long lVar3;
  lzma_options_lzma *plVar4;
  _Bool _Var5;
  byte bVar6;
  
  bVar6 = 0;
  if (options == (void *)0x0) {
    return LZMA_PROG_ERROR;
  }
  if (lz->coder == (lzma_coder_conflict7 *)0x0) {
    plVar2 = (lzma_coder_conflict7 *)lzma_alloc(0x100a8,allocator);
    lz->coder = plVar2;
    if (plVar2 == (lzma_coder_conflict7 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    lz->code = lzma2_encode;
    lz->end = lzma2_encoder_end;
    lz->options_update = lzma2_encoder_options_update;
    plVar2->lzma = (lzma_coder_conflict7 *)0x0;
  }
  plVar4 = &lz->coder->opt_cur;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)plVar4 = *options;
    options = (undefined8 *)((long)options + ((ulong)bVar6 * -2 + 1) * 8);
    plVar4 = (lzma_options_lzma *)((long)plVar4 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  plVar2 = lz->coder;
  plVar2->sequence = SEQ_INDICATOR;
  plVar2->need_properties = true;
  plVar2->need_state_reset = false;
  if ((plVar2->opt_cur).preset_dict == (uint8_t *)0x0) {
    _Var5 = true;
  }
  else {
    _Var5 = (plVar2->opt_cur).preset_dict_size == 0;
  }
  plVar2->need_dictionary_reset = _Var5;
  lVar1 = lzma_lzma_encoder_create
                    ((lzma_coder_conflict9 **)&plVar2->lzma,allocator,&plVar2->opt_cur,lz_options);
  if (lVar1 == LZMA_OK) {
    lVar1 = LZMA_OK;
    if (lz_options->before_size + lz_options->dict_size < 0x10000) {
      lz_options->before_size = 0x10000 - lz_options->dict_size;
    }
  }
  return lVar1;
}

Assistant:

static lzma_ret
lzma2_encoder_init(lzma_lz_encoder *lz, lzma_allocator *allocator,
		const void *options, lzma_lz_options *lz_options)
{
	if (options == NULL)
		return LZMA_PROG_ERROR;

	if (lz->coder == NULL) {
		lz->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (lz->coder == NULL)
			return LZMA_MEM_ERROR;

		lz->code = &lzma2_encode;
		lz->end = &lzma2_encoder_end;
		lz->options_update = &lzma2_encoder_options_update;

		lz->coder->lzma = NULL;
	}

	lz->coder->opt_cur = *(const lzma_options_lzma *)(options);

	lz->coder->sequence = SEQ_INIT;
	lz->coder->need_properties = true;
	lz->coder->need_state_reset = false;
	lz->coder->need_dictionary_reset
			= lz->coder->opt_cur.preset_dict == NULL
			|| lz->coder->opt_cur.preset_dict_size == 0;

	// Initialize LZMA encoder
	return_if_error(lzma_lzma_encoder_create(&lz->coder->lzma, allocator,
			&lz->coder->opt_cur, lz_options));

	// Make sure that we will always have enough history available in
	// case we need to use uncompressed chunks. They are used when the
	// compressed size of a chunk is not smaller than the uncompressed
	// size, so we need to have at least LZMA2_COMPRESSED_MAX bytes
	// history available.
	if (lz_options->before_size + lz_options->dict_size < LZMA2_CHUNK_MAX)
		lz_options->before_size
				= LZMA2_CHUNK_MAX - lz_options->dict_size;

	return LZMA_OK;
}